

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexPacket.cpp
# Opt level: O2

void __thiscall rr::VertexPacketAllocator::~VertexPacketAllocator(VertexPacketAllocator *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  size_t i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppcVar1 = (this->m_allocations).
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar2 = (this->m_allocations).
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppcVar2 - (long)ppcVar1 >> 3) <= uVar3) break;
    if (ppcVar1[uVar3] != (char *)0x0) {
      operator_delete__(ppcVar1[uVar3]);
    }
    uVar3 = uVar3 + 1;
  }
  if (ppcVar2 != ppcVar1) {
    (this->m_allocations).super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar1;
  }
  std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~_Vector_base
            (&(this->m_singleAllocPool).
              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>);
  std::_Vector_base<signed_char_*,_std::allocator<signed_char_*>_>::~_Vector_base
            (&(this->m_allocations).
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>);
  return;
}

Assistant:

VertexPacketAllocator::~VertexPacketAllocator (void)
{
	for (size_t i = 0; i < m_allocations.size(); ++i)
		delete [] m_allocations[i];
	m_allocations.clear();
}